

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

MP<135UL,_GF2::MOLex<135UL>_> * __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::operator%=
          (MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  ulong uVar4;
  ulong uVar5;
  
  p_Var3 = (this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
           super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    while( true ) {
      if (p_Var3 == (_List_node_base *)this) {
        return this;
      }
      if (((mRight->super_WW<135UL>)._words[0] &
          ~*(ulong *)&((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)(p_Var3 + 1))->
                      super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>) == 0)
      break;
LAB_00123b9e:
      p_Var3 = (((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)&p_Var3->_M_next)->
               super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    }
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (uVar5 == 2) goto LAB_00123bca;
      uVar4 = uVar5 + 1;
    } while (((mRight->super_WW<135UL>)._words[uVar5 + 1] &
             ~*(ulong *)((long)(p_Var3 + 1) + 8U + uVar5 * 8)) == 0);
    if (uVar5 < 2) goto LAB_00123b9e;
LAB_00123bca:
    p_Var2 = p_Var3->_M_next;
    psVar1 = &(this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
              super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x28);
    p_Var3 = p_Var2;
  } while( true );
}

Assistant:

MP& operator%=(const MM<_n>& mRight)
	{	
		for (iterator iter = begin(); iter != end();)
			if (iter->IsDivisibleBy(mRight)) 
				iter = erase(iter);
			else ++iter;
		return *this;
	}